

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

RPCHelpMan * createpsbt(void)

{
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  _Manager_type in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffdf8;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe38 [24];
  pointer in_stack_fffffffffffffe50;
  RPCMethodImpl in_stack_fffffffffffffe58;
  string local_178;
  string local_158;
  char *local_138;
  size_type local_130;
  char local_128 [8];
  undefined8 uStack_120;
  string local_118 [32];
  string local_f8 [32];
  RPCResult local_d8;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"createpsbt",(allocator<char> *)&stack0xfffffffffffffe67);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "\nCreates a transaction in the Partially Signed Transaction format.\nImplements the Creator role.\n"
             ,(allocator<char> *)&stack0xfffffffffffffe66);
  CreateTxDoc();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"",(allocator<char> *)&stack0xfffffffffffffe2f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"The resulting raw transaction (base64-encoded string)",
             (allocator<char> *)&stack0xfffffffffffffe2e);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffdd0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffde0;
  description._M_string_length = in_stack_fffffffffffffdf0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffde8;
  description.field_2 = in_stack_fffffffffffffdf8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_d8,STR,m_key_name,description,inner,SUB81(local_f8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdd0;
  result._0_8_ = in_stack_fffffffffffffdc8;
  result.m_key_name._M_string_length = in_stack_fffffffffffffdd8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffde0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffde8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdf0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffdf8;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffe20;
  result.m_cond._M_string_length = in_stack_fffffffffffffe38._0_8_;
  result.m_cond.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffe38._8_16_;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffe30,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"createpsbt",(allocator<char> *)&stack0xfffffffffffffe07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe68,
             "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\""
             ,(allocator<char> *)&stack0xfffffffffffffe06);
  HelpExampleCli(&local_158,&local_178,(string *)&stack0xfffffffffffffe68);
  local_138 = local_128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == &local_158.field_2) {
    uStack_120 = local_158.field_2._8_8_;
  }
  else {
    local_138 = local_158._M_dataplus._M_p;
  }
  local_130 = local_158._M_string_length;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1580:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1580:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffdf8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffe50;
  examples.m_examples._0_24_ = in_stack_fffffffffffffe38;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffdd0,&stack0xfffffffffffffdd8)),
             description_00,args,(RPCResults)in_stack_fffffffffffffe20,examples,
             in_stack_fffffffffffffe58);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffdd8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  std::__cxx11::string::~string((string *)&local_178);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffe30);
  RPCResult::~RPCResult(&local_d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffe08);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffe48);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createpsbt()
{
    return RPCHelpMan{"createpsbt",
                "\nCreates a transaction in the Partially Signed Transaction format.\n"
                "Implements the Creator role.\n",
                CreateTxDoc(),
                RPCResult{
                    RPCResult::Type::STR, "", "The resulting raw transaction (base64-encoded string)"
                },
                RPCExamples{
                    HelpExampleCli("createpsbt", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{

    std::optional<bool> rbf;
    if (!request.params[3].isNull()) {
        rbf = request.params[3].get_bool();
    }
    CMutableTransaction rawTx = ConstructTransaction(request.params[0], request.params[1], request.params[2], rbf);

    // Make a blank psbt
    PartiallySignedTransaction psbtx;
    psbtx.tx = rawTx;
    for (unsigned int i = 0; i < rawTx.vin.size(); ++i) {
        psbtx.inputs.emplace_back();
    }
    for (unsigned int i = 0; i < rawTx.vout.size(); ++i) {
        psbtx.outputs.emplace_back();
    }

    // Serialize the PSBT
    DataStream ssTx{};
    ssTx << psbtx;

    return EncodeBase64(ssTx);
},
    };
}